

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O0

void __thiscall raptor::TcpServer::OnErrorEvent(TcpServer *this,void *ptr)

{
  bool bVar1;
  element_type *this_00;
  undefined1 local_38 [8];
  shared_ptr<raptor::Connection> con;
  uint32_t index;
  ConnectionId cid;
  void *ptr_local;
  TcpServer *this_local;
  
  con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       CheckConnectionId(this,(ConnectionId)ptr);
  if (con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
      == 0xffffffff) {
    LogFormatPrint("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/linux/tcp_server.cc"
                   ,0xf3,kLogLevelError,"tcpserver: OnErrorEvent found invalid index, cid = %x",ptr)
    ;
  }
  else {
    GetConnection((TcpServer *)local_38,(uint32_t)this);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<raptor::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<raptor::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_38);
      Connection::Shutdown(this_00,true);
      DeleteConnection(this,con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi._4_4_);
    }
    std::shared_ptr<raptor::Connection>::~shared_ptr((shared_ptr<raptor::Connection> *)local_38);
  }
  return;
}

Assistant:

void TcpServer::OnErrorEvent(void* ptr) {
    ConnectionId cid = (ConnectionId)ptr;
    uint32_t index = CheckConnectionId(cid);
    if (index == InvalidIndex) {
        log_error("tcpserver: OnErrorEvent found invalid index, cid = %x", cid);
        return;
    }

    auto con = GetConnection(index);
    if (con) {
        con->Shutdown(true);
        DeleteConnection(index);
    }
}